

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonEachBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  sqlite3_index_constraint_usage *psVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uchar *puVar7;
  int iVar8;
  uint uVar9;
  long in_FS_OFFSET;
  int local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10[0] = -1;
  local_10[1] = -1;
  iVar8 = 0;
  iVar3 = pIdxInfo->nConstraint;
  if (pIdxInfo->nConstraint < 1) {
    iVar3 = iVar8;
  }
  puVar7 = &pIdxInfo->aConstraint->usable;
  uVar2 = 0;
  uVar6 = 0;
  while( true ) {
    if (iVar3 == iVar8) break;
    if (7 < ((sqlite3_index_constraint *)(puVar7 + -5))->iColumn) {
      uVar4 = ((sqlite3_index_constraint *)(puVar7 + -5))->iColumn - 8;
      uVar9 = 1 << ((byte)uVar4 & 0x1f);
      if (*puVar7 == '\0') {
        uVar2 = uVar2 | uVar9;
      }
      else if (puVar7[-1] == '\x02') {
        local_10[uVar4] = iVar8;
        uVar6 = uVar6 | uVar9;
      }
    }
    iVar8 = iVar8 + 1;
    puVar7 = puVar7 + 0xc;
  }
  if (((0 < pIdxInfo->nOrderBy) && (pIdxInfo->aOrderBy->iColumn < 0)) &&
     (pIdxInfo->aOrderBy->desc == '\0')) {
    pIdxInfo->orderByConsumed = 1;
  }
  if ((uVar2 & ~uVar6) == 0) {
    lVar5 = (long)local_10[0];
    iVar3 = 0;
    iVar8 = 0;
    if (-1 < lVar5) {
      pIdxInfo->estimatedCost = 1.0;
      psVar1 = pIdxInfo->aConstraintUsage;
      psVar1[lVar5].argvIndex = 1;
      psVar1[lVar5].omit = '\x01';
      lVar5 = (long)local_10[1];
      iVar8 = 1;
      if (-1 < lVar5) {
        psVar1[lVar5].argvIndex = 2;
        psVar1[lVar5].omit = '\x01';
        iVar8 = 3;
      }
    }
    pIdxInfo->idxNum = iVar8;
  }
  else {
    iVar3 = 0x13;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int jsonEachBestIndex(
  sqlite3_vtab *tab,
  sqlite3_index_info *pIdxInfo
){
  int i;                     /* Loop counter or computed array index */
  int aIdx[2];               /* Index of constraints for JSON and ROOT */
  int unusableMask = 0;      /* Mask of unusable JSON and ROOT constraints */
  int idxMask = 0;           /* Mask of usable == constraints JSON and ROOT */
  const struct sqlite3_index_constraint *pConstraint;

  /* This implementation assumes that JSON and ROOT are the last two
  ** columns in the table */
  assert( JEACH_ROOT == JEACH_JSON+1 );
  UNUSED_PARAMETER(tab);
  aIdx[0] = aIdx[1] = -1;
  pConstraint = pIdxInfo->aConstraint;
  for(i=0; i<pIdxInfo->nConstraint; i++, pConstraint++){
    int iCol;
    int iMask;
    if( pConstraint->iColumn < JEACH_JSON ) continue;
    iCol = pConstraint->iColumn - JEACH_JSON;
    assert( iCol==0 || iCol==1 );
    testcase( iCol==0 );
    iMask = 1 << iCol;
    if( pConstraint->usable==0 ){
      unusableMask |= iMask;
    }else if( pConstraint->op==SQLITE_INDEX_CONSTRAINT_EQ ){
      aIdx[iCol] = i;
      idxMask |= iMask;
    }
  }
  if( pIdxInfo->nOrderBy>0
   && pIdxInfo->aOrderBy[0].iColumn<0
   && pIdxInfo->aOrderBy[0].desc==0
  ){
    pIdxInfo->orderByConsumed = 1;
  }

  if( (unusableMask & ~idxMask)!=0 ){
    /* If there are any unusable constraints on JSON or ROOT, then reject
    ** this entire plan */
    return SQLITE_CONSTRAINT;
  }
  if( aIdx[0]<0 ){
    /* No JSON input.  Leave estimatedCost at the huge value that it was
    ** initialized to to discourage the query planner from selecting this
    ** plan. */
    pIdxInfo->idxNum = 0;
  }else{
    pIdxInfo->estimatedCost = 1.0;
    i = aIdx[0];
    pIdxInfo->aConstraintUsage[i].argvIndex = 1;
    pIdxInfo->aConstraintUsage[i].omit = 1;
    if( aIdx[1]<0 ){
      pIdxInfo->idxNum = 1;  /* Only JSON supplied.  Plan 1 */
    }else{
      i = aIdx[1];
      pIdxInfo->aConstraintUsage[i].argvIndex = 2;
      pIdxInfo->aConstraintUsage[i].omit = 1;
      pIdxInfo->idxNum = 3;  /* Both JSON and ROOT are supplied.  Plan 3 */
    }
  }
  return SQLITE_OK;
}